

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void config_free(ConfigScanner *sc)

{
  long *in_RDI;
  SectionList *s_prev;
  SectionList *s_item;
  ConfigItem *c_prev;
  ConfigItem *c_item;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  
  if (in_RDI != (long *)0x0) {
    local_10 = (undefined8 *)in_RDI[2];
    local_18 = (undefined8 *)0x0;
    for (; local_10 != (undefined8 *)0x0; local_10 = (undefined8 *)*local_10) {
      if (local_18 != (undefined8 *)0x0) {
        free(local_18);
      }
      if (local_10[2] != 0) {
        free((void *)local_10[2]);
      }
      if ((*(int *)(local_10 + 3) == 1) && (local_10[4] != 0)) {
        free((void *)local_10[4]);
      }
      local_18 = local_10;
    }
    if (local_18 != (undefined8 *)0x0) {
      free(local_18);
    }
    local_20 = (undefined8 *)in_RDI[1];
    local_28 = (undefined8 *)0x0;
    for (; local_20 != (undefined8 *)0x0; local_20 = (undefined8 *)*local_20) {
      if (local_28 != (undefined8 *)0x0) {
        free(local_28);
      }
      if (local_20[1] != 0) {
        free((void *)local_20[1]);
      }
      local_28 = local_20;
    }
    if (local_28 != (undefined8 *)0x0) {
      free(local_28);
    }
    if ((in_RDI != (long *)0x0) && (*in_RDI != 0)) {
      free((void *)*in_RDI);
    }
    if (in_RDI != (long *)0x0) {
      free(in_RDI);
    }
  }
  return;
}

Assistant:

void config_free(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return;
	}
	ConfigItem *c_item = sc->first_item;
	ConfigItem *c_prev = NULL;
	while (c_item != NULL)
	{
		if (c_prev)
		{
			free(c_prev);
		}
		if (c_item->key)
		{
			free(c_item->key);
		}
		if (c_item->vtype == VTYPE_STRING && c_item->value.v_string)
		{
			free(c_item->value.v_string);
		}
		c_prev = c_item;
		c_item = c_item->succ;
	}
	if (c_prev)
	{
		free(c_prev);
	}

	SectionList *s_item = sc->first_section;
	SectionList *s_prev = NULL;
	while (s_item != NULL)
	{
		if (s_prev)
		{
			free(s_prev);
		}
		if (s_item->name)
		{
			free(s_item->name);
		}
		s_prev = s_item;
		s_item = s_item->succ;
	}
	if (s_prev)
	{
		free(s_prev);
	}

	if (sc != NULL && sc->base != NULL)
	{
		free(sc->base);
	}

	if (sc != NULL)
	{
		free(sc);
	}
}